

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

CFGNode * __thiscall
dxil_spv::CFGStructurizer::create_helper_pred_block(CFGStructurizer *this,CFGNode *node)

{
  pointer ppCVar1;
  uint32_t uVar2;
  CFGNode *new_node;
  CFGNode *pCVar3;
  pointer ppCVar4;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> bStack_48;
  
  new_node = CFGNodePool::create_node(this->pool);
  std::operator+(&bStack_48,&node->name,".pred");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&new_node->name,&bStack_48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&bStack_48);
  uVar2 = node->backward_post_visit_order;
  new_node->forward_post_visit_order = node->forward_post_visit_order;
  new_node->backward_post_visit_order = uVar2;
  std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
  _Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&new_node->pred,(_Vector_impl_data *)&node->pred);
  ppCVar1 = (node->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar4 = (node->headers).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
      ppCVar4 = ppCVar4 + 1) {
    CFGNode::fixup_merge_info_after_branch_rewrite(*ppCVar4,node,new_node);
  }
  ppCVar4 = (node->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((node->headers).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar4) {
    (node->headers).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar4;
  }
  node->split_merge_block_candidate = new_node;
  pCVar3 = new_node;
  if (node->immediate_dominator != node) {
    pCVar3 = node->immediate_dominator;
  }
  new_node->immediate_dominator = pCVar3;
  new_node->immediate_post_dominator = node;
  node->immediate_dominator = new_node;
  retarget_pred_from(this,new_node,node);
  CFGNode::add_branch(new_node,node);
  if (this->entry_block == node) {
    this->entry_block = new_node;
  }
  (new_node->ir).terminator.type = Branch;
  (new_node->ir).terminator.direct_block = node;
  return new_node;
}

Assistant:

CFGNode *CFGStructurizer::create_helper_pred_block(CFGNode *node)
{
	auto *pred_node = pool.create_node();
	pred_node->name = node->name + ".pred";

	// Fixup visit order later.
	pred_node->forward_post_visit_order = node->forward_post_visit_order;
	pred_node->backward_post_visit_order = node->backward_post_visit_order;

	std::swap(pred_node->pred, node->pred);
	for (auto *header : node->headers)
		header->fixup_merge_info_after_branch_rewrite(node, pred_node);
	node->headers.clear();

	// When splitting merge scopes, need to consider these pred blocks as well
	// since they might end up with headers.size() >= 2.
	node->split_merge_block_candidate = pred_node;

	// We're replacing entry block.
	if (node == node->immediate_dominator)
		pred_node->immediate_dominator = pred_node;
	else
		pred_node->immediate_dominator = node->immediate_dominator;

	pred_node->immediate_post_dominator = node;
	node->immediate_dominator = pred_node;

	retarget_pred_from(pred_node, node);

	pred_node->add_branch(node);

	if (node == entry_block)
		entry_block = pred_node;

	pred_node->ir.terminator.type = Terminator::Type::Branch;
	pred_node->ir.terminator.direct_block = node;

	return pred_node;
}